

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O1

uint8_t rfc5497_timetlv_encode(uint64_t decoded)

{
  undefined1 auVar1 [16];
  uint8_t uVar2;
  char cVar3;
  char cVar4;
  uint64_t uVar5;
  bool bVar6;
  
  if (decoded == 0) {
    uVar2 = '\0';
  }
  else {
    uVar2 = 0xff;
    if (decoded < 0xdac00001) {
      cVar3 = '\n';
      uVar5 = decoded;
      cVar4 = '\n';
      if (decoded < 1000) {
        do {
          cVar3 = cVar4 + -1;
          decoded = uVar5 * 2;
          bVar6 = uVar5 < 500;
          uVar5 = decoded;
          cVar4 = cVar3;
        } while (bVar6);
      }
      else if (0x753 < decoded) {
        cVar3 = '\n';
        do {
          cVar3 = cVar3 + '\x01';
          decoded = uVar5 + 1 >> 1;
          bVar6 = 0xea6 < uVar5;
          uVar5 = decoded;
        } while (bVar6);
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = decoded - 0x36c;
      return (char)((uint)((int)((decoded - 0x36c) - SUB168(auVar1 * ZEXT816(0x624dd2f1a9fbe77),8)
                                >> 1) + SUB164(auVar1 * ZEXT816(0x624dd2f1a9fbe77),8)) >> 6) +
             cVar3 * '\b';
    }
  }
  return uVar2;
}

Assistant:

uint8_t
rfc5497_timetlv_encode(uint64_t decoded) {
  uint32_t a, b;
  /*
   * t = (1 + a/8) * 2^b * 1000 / 1024
   *   = (1000 + 125 * a) * (2^b / 2^10)
   *   = (1000 + 125 * a) * 2 ^ (b-10)
   */

  if (decoded < RFC5497_TIMETLV_MIN) {
    return 0;
  }
  if (decoded > RFC5497_TIMETLV_MAX) {
    return 255;
  }

  b = 10;
  if (decoded >= 1000) {
    /* this means b >= 10 */
    while (decoded > 1875) {
      b++;

      /* divide by 2 and round up */
      decoded++;
      decoded >>= 1;
    }
  }
  else { /* decoded < 1000 */
    /* b < 10 */
    while (decoded < 1000) {
      b--;
      decoded <<= 1;
    }
  }

  a = (decoded - 1000 + 124) / 125;
  return a + (b << 3);
}